

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locmap.cpp
# Opt level: O0

int32_t uprv_convertToPosix_63
                  (uint32_t hostid,char *posixID,int32_t posixIDCapacity,UErrorCode *status)

{
  size_t sVar1;
  int local_5c;
  int32_t copyLen;
  int32_t resLen;
  char *pCandidate;
  char *pPosixID;
  uint local_30;
  UBool bLookup;
  uint32_t localeIndex;
  uint16_t langID;
  UErrorCode *status_local;
  int32_t posixIDCapacity_local;
  char *posixID_local;
  uint32_t hostid_local;
  
  pCandidate = (char *)0x0;
  _copyLen = (char *)0x0;
  local_30 = 0;
  do {
    if (0x8c < local_30) {
LAB_004056bb:
      if (_copyLen != (char *)0x0) {
        pCandidate = _copyLen;
      }
      if (pCandidate == (char *)0x0) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        posixID_local._4_4_ = -1;
      }
      else {
        sVar1 = strlen(pCandidate);
        posixID_local._4_4_ = (int)sVar1;
        local_5c = posixIDCapacity;
        if (posixID_local._4_4_ <= posixIDCapacity) {
          local_5c = posixID_local._4_4_;
        }
        memcpy(posixID,pCandidate,(long)local_5c);
        if (posixID_local._4_4_ < posixIDCapacity) {
          posixID[posixID_local._4_4_] = '\0';
          if (*status == U_STRING_NOT_TERMINATED_WARNING) {
            *status = U_ZERO_ERROR;
          }
        }
        else if (posixID_local._4_4_ == posixIDCapacity) {
          *status = U_STRING_NOT_TERMINATED_WARNING;
        }
        else {
          *status = U_BUFFER_OVERFLOW_ERROR;
        }
      }
      return posixID_local._4_4_;
    }
    if ((uint)((ushort)hostid & 0x3ff) == (gPosixIDmap[local_30].regionMaps)->hostID) {
      _copyLen = getPosixID(gPosixIDmap + local_30,hostid);
      goto LAB_004056bb;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

U_CAPI int32_t
uprv_convertToPosix(uint32_t hostid, char *posixID, int32_t posixIDCapacity, UErrorCode* status)
{
    uint16_t langID;
    uint32_t localeIndex;
    UBool bLookup = TRUE;
    const char *pPosixID = NULL;

#ifdef USE_WINDOWS_LCID_MAPPING_API
    char locName[LOCALE_NAME_MAX_LENGTH] = {};      // ICU name can't be longer than Windows name

    // Note: Windows primary lang ID 0x92 in LCID is used for Central Kurdish and
    // GetLocaleInfo() maps such LCID to "ku". However, CLDR uses "ku" for
    // Northern Kurdish and "ckb" for Central Kurdish. For this reason, we cannot
    // use the Windows API to resolve locale ID for this specific case.
    if ((hostid & 0x3FF) != 0x92) {
        int32_t tmpLen = 0;
        UChar windowsLocaleName[LOCALE_NAME_MAX_LENGTH];  // ULOC_FULLNAME_CAPACITY > LOCALE_NAME_MAX_LENGTH

        // Note: LOCALE_ALLOW_NEUTRAL_NAMES was enabled in Windows7+, prior versions did not handle neutral (no-region) locale names.
        tmpLen = LCIDToLocaleName(hostid, (PWSTR)windowsLocaleName, UPRV_LENGTHOF(windowsLocaleName), LOCALE_ALLOW_NEUTRAL_NAMES);
        if (tmpLen > 1) {
            int32_t i = 0;
            // Only need to look up in table if have _, eg for de-de_phoneb type alternate sort.
            bLookup = FALSE;
            for (i = 0; i < UPRV_LENGTHOF(locName); i++)
            {
                locName[i] = (char)(windowsLocaleName[i]);

                // Windows locale name may contain sorting variant, such as "es-ES_tradnl".
                // In such cases, we need special mapping data found in the hardcoded table
                // in this source file.
                if (windowsLocaleName[i] == L'_')
                {
                    // Keep the base locale, without variant
                    // TODO: Should these be mapped from _phoneb to @collation=phonebook, etc.?
                    locName[i] = '\0';
                    tmpLen = i;
                    bLookup = TRUE;
                    break;
                }
                else if (windowsLocaleName[i] == L'-')
                {
                    // Windows names use -, ICU uses _
                    locName[i] = '_';
                }
                else if (windowsLocaleName[i] == L'\0')
                {
                    // No point in doing more work than necessary
                    break;
                }
            }
            // TODO: Need to understand this better, why isn't it an alias?
            FIX_LANGUAGE_ID_TAG(locName, tmpLen);
            pPosixID = locName;
        }
    }
#endif // USE_WINDOWS_LCID_MAPPING_API

    if (bLookup) {
        const char *pCandidate = NULL;
        langID = LANGUAGE_LCID(hostid);

        for (localeIndex = 0; localeIndex < gLocaleCount; localeIndex++) {
            if (langID == gPosixIDmap[localeIndex].regionMaps->hostID) {
                pCandidate = getPosixID(&gPosixIDmap[localeIndex], hostid);
                break;
            }
        }

        /* On Windows, when locale name has a variant, we still look up the hardcoded table.
           If a match in the hardcoded table is longer than the Windows locale name without
           variant, we use the one as the result */
        if (pCandidate && (pPosixID == NULL || uprv_strlen(pCandidate) > uprv_strlen(pPosixID))) {
            pPosixID = pCandidate;
        }
    }

    if (pPosixID) {
        int32_t resLen = static_cast<int32_t>(uprv_strlen(pPosixID));
        int32_t copyLen = resLen <= posixIDCapacity ? resLen : posixIDCapacity;
        uprv_memcpy(posixID, pPosixID, copyLen);
        if (resLen < posixIDCapacity) {
            posixID[resLen] = 0;
            if (*status == U_STRING_NOT_TERMINATED_WARNING) {
                *status = U_ZERO_ERROR;
            }
        } else if (resLen == posixIDCapacity) {
            *status = U_STRING_NOT_TERMINATED_WARNING;
        } else {
            *status = U_BUFFER_OVERFLOW_ERROR;
        }
        return resLen;
    }

    /* no match found */
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return -1;
}